

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fzn-chuffed.cpp
# Opt level: O3

string * get_bv_string_abi_cxx11_(string *__return_storage_ptr__,BoolView *b,bool tryIntDom)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ostream *poVar2;
  uint uVar3;
  int iVar4;
  char *pcVar5;
  pointer pcVar6;
  size_t sVar7;
  mapped_type *pmVar8;
  mapped_type *pmVar9;
  undefined7 in_register_00000011;
  string s;
  string ivstring;
  BoolView o;
  BoolView o_1;
  stringstream ss;
  _Alloc_hider local_250;
  char *local_248;
  char local_240;
  undefined7 uStack_23f;
  undefined8 uStack_238;
  int local_22c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  char *local_208;
  long local_200;
  char local_1f8 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  key_type local_1c8;
  undefined1 local_1b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8 [7];
  ios_base local_138 [264];
  
  local_248 = (char *)0x0;
  local_240 = '\0';
  local_250._M_p = &local_240;
  if ((int)CONCAT71(in_register_00000011,tryIntDom) == 0) {
    pmVar8 = std::
             map<BoolView,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<BoolView>,_std::allocator<std::pair<const_BoolView,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&boolVarString_abi_cxx11_,b);
    paVar1 = &local_228.field_2;
    pcVar6 = (pmVar8->_M_dataplus)._M_p;
    local_228._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_228,pcVar6,pcVar6 + pmVar8->_M_string_length);
    if (local_228._M_string_length == 0) {
      local_1c8.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_0020bb98;
      local_1c8.v = b->v;
      local_1c8.s = (bool)(b->s ^ 1);
      pmVar8 = std::
               map<BoolView,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<BoolView>,_std::allocator<std::pair<const_BoolView,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&boolVarString_abi_cxx11_,&local_1c8);
      pcVar6 = (pmVar8->_M_dataplus)._M_p;
      local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1e8,pcVar6,pcVar6 + pmVar8->_M_string_length);
      if (CONCAT44(local_1e8._M_string_length._4_4_,(int)local_1e8._M_string_length) == 0) {
        uVar3 = *(uint *)(sat.c_info.data + (uint)b->v);
        local_22c = sat.c_info.data[(uint)b->v].val;
        pmVar9 = std::
                 map<IntVar_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<IntVar_*>,_std::allocator<std::pair<IntVar_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&intVarString_abi_cxx11_,
                              (key_type *)((ulong)(uVar3 * 8) + (long)engine.vars.data));
        local_208 = local_1f8;
        pcVar6 = (pmVar9->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_208,pcVar6,pcVar6 + pmVar9->_M_string_length);
        if (((uVar3 & 0x60000000) == 0x20000000) && (local_200 != 0)) {
          std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
          poVar2 = (ostream *)(local_1b8 + 0x10);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_208,local_200);
          pcVar5 = irel_str[(ulong)b->s + 2];
          if (pcVar5 == (char *)0x0) {
            std::ios::clear((int)*(undefined8 *)(local_1a8[0]._M_allocated_capacity - 0x18) +
                            (int)poVar2);
          }
          else {
            sVar7 = strlen(pcVar5);
            std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar5,sVar7);
          }
          std::ostream::operator<<((ostream *)poVar2,local_22c);
          std::__cxx11::stringbuf::str();
          std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
          std::ios_base::~ios_base(local_138);
        }
        else {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)__return_storage_ptr__,"<UNKNOWN>","");
        }
        if (local_208 != local_1f8) {
          operator_delete(local_208);
        }
      }
      else {
        std::operator+(__return_storage_ptr__,"~ ",&local_1e8);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
        operator_delete(local_1e8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p != paVar1) {
        operator_delete(local_228._M_dataplus._M_p);
      }
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p == paVar1) {
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             local_228.field_2._M_allocated_capacity;
        *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_228.field_2._8_8_;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = local_228._M_dataplus._M_p;
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             local_228.field_2._M_allocated_capacity;
      }
      __return_storage_ptr__->_M_string_length = local_228._M_string_length;
    }
  }
  else {
    uVar3 = *(uint *)(sat.c_info.data + (uint)b->v);
    iVar4 = sat.c_info.data[(uint)b->v].val;
    std::
    map<IntVar_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<IntVar_*>,_std::allocator<std::pair<IntVar_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator[](&intVarString_abi_cxx11_,(key_type *)((ulong)(uVar3 * 8) + (long)engine.vars.data))
    ;
    std::__cxx11::string::_M_assign((string *)&local_250);
    if (((uVar3 & 0x60000000) == 0x20000000) && (local_248 != (char *)0x0)) {
      std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
      poVar2 = (ostream *)(local_1b8 + 0x10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_250._M_p,(long)local_248);
      pcVar5 = irel_str[(ulong)b->s + 2];
      if (pcVar5 == (char *)0x0) {
        std::ios::clear((int)poVar2 +
                        (int)*(undefined8 *)(local_1a8[0]._M_allocated_capacity - 0x18));
      }
      else {
        sVar7 = strlen(pcVar5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar5,sVar7);
      }
      std::ostream::operator<<((ostream *)poVar2,iVar4);
      std::__cxx11::stringbuf::str();
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
      std::ios_base::~ios_base(local_138);
    }
    else {
      std::
      map<BoolView,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<BoolView>,_std::allocator<std::pair<const_BoolView,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator[](&boolVarString_abi_cxx11_,b);
      std::__cxx11::string::_M_assign((string *)&local_250);
      if (local_248 == (char *)0x0) {
        local_1e8._M_dataplus._M_p = (pointer)&PTR_finished_0020bb98;
        local_1e8._M_string_length._0_4_ = b->v;
        local_1e8._M_string_length._4_4_ =
             CONCAT31((int3)(local_1e8._M_string_length._4_4_ >> 8),b->s) ^ 1;
        pmVar8 = std::
                 map<BoolView,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<BoolView>,_std::allocator<std::pair<const_BoolView,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&boolVarString_abi_cxx11_,(key_type *)&local_1e8);
        pcVar6 = (pmVar8->_M_dataplus)._M_p;
        local_1b8._0_8_ = local_1b8 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_1b8,pcVar6,pcVar6 + pmVar8->_M_string_length);
        if (local_1b8._8_8_ == 0) {
          std::__cxx11::string::_M_replace((ulong)&local_250,0,local_248,0x1d402e);
        }
        else {
          std::operator+(&local_228,"~ ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1b8);
          std::__cxx11::string::operator=((string *)&local_250,(string *)&local_228);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_228._M_dataplus._M_p != &local_228.field_2) {
            operator_delete(local_228._M_dataplus._M_p);
          }
        }
        if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
          operator_delete((void *)local_1b8._0_8_);
        }
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      if (local_250._M_p == &local_240) {
        (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_23f,local_240);
        *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_238;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = local_250._M_p;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_23f,local_240);
      }
      __return_storage_ptr__->_M_string_length = (size_type)local_248;
      local_248 = (char *)0x0;
      local_240 = '\0';
      local_250._M_p = &local_240;
    }
  }
  if (local_250._M_p != &local_240) {
    operator_delete(local_250._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string get_bv_string(const BoolView& b, bool tryIntDom) {
	std::string s;

	if (tryIntDom) {
		// Alternate version: prioritise intvars.
		const Lit l(b.getLit(true));
		const ChannelInfo ci(sat.c_info[var(l)]);
		s = intVarString[engine.vars[ci.cons_id]];
		if (ci.cons_type == 1 && !s.empty()) {
			// Int literal
			std::stringstream ss;
			ss << s;
			ss << irel_str[2 * ci.cons_type + static_cast<int>(b.getSign())];
			ss << ci.val;
			return ss.str();
		}
		s = boolVarString[b];
		if (s.empty()) {
			BoolView o(b);
			o.setSign(!o.getSign());
			const std::string ostring = boolVarString[o];
			if (!ostring.empty()) {
				s = "~ " + ostring;
			} else {
				s = "<UNKNOWN>";
			}
		}
		return s;

	}  // See if b or ~b have names.
	std::string bvstring = boolVarString[b];
	if (bvstring.empty()) {
		BoolView o(b);
		o.setSign(!o.getSign());
		const std::string ostring = boolVarString[o];
		if (ostring.empty()) {
			// Maybe it's attached to a (named) intvar.
			const Lit l(b.getLit(true));
			const ChannelInfo ci(sat.c_info[var(l)]);
			const std::string ivstring = intVarString[engine.vars[ci.cons_id]];
			if (ci.cons_type == 1 && !ivstring.empty()) {
				// If it is, return the denotation of b.
				std::stringstream ss;
				ss << ivstring;
				ss << irel_str[2 * ci.cons_type + static_cast<int>(b.getSign())];
				ss << ci.val;
				return ss.str();
			}
			return "<UNKNOWN>";
		}
		return "~ " + ostring;
	}
	return bvstring;
}